

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int encode_client_hello(ptls_context_t *ctx,ptls_buffer_t *sendbuf,encode_ch_mode mode,
                       int is_second_flight,ptls_handshake_properties_t *properties,
                       void *client_random,ptls_key_exchange_context_t *key_share_ctx,char *sni_name
                       ,ptls_iovec_t legacy_session_id,st_ptls_ech_t *ech,size_t *ech_size_offset,
                       ptls_iovec_t ech_replay,ptls_iovec_t psk_secret,ptls_iovec_t psk_identity,
                       uint32_t obfuscated_ticket_age,size_t psk_binder_size,ptls_iovec_t *cookie,
                       int using_early_data)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  undefined8 *puVar4;
  ulong uVar5;
  size_t local_5d8;
  size_t body_size;
  size_t body_size_4;
  size_t body_size_33;
  size_t body_size_36;
  size_t body_size_37;
  size_t body_start_37;
  size_t capacity_37;
  size_t body_start_36;
  size_t capacity_36;
  size_t body_size_34;
  uint32_t local_4d0;
  uint32_t local_4cc;
  uint32_t _v_25;
  uint32_t age;
  size_t body_size_35;
  size_t body_start_35;
  size_t capacity_35;
  size_t body_start_34;
  size_t capacity_34;
  size_t body_start_33;
  size_t capacity_33;
  ulong uStack_488;
  uint16_t _v_24;
  size_t body_size_32;
  size_t body_start_32;
  size_t capacity_32;
  ulong uStack_468;
  uint16_t _v_23;
  size_t body_size_30;
  size_t body_size_31;
  size_t local_450;
  size_t body_start_31;
  size_t capacity_31;
  size_t body_start_30;
  size_t capacity_30;
  ulong uStack_428;
  uint16_t _v_22;
  size_t body_size_29;
  size_t local_418;
  size_t body_start_29;
  size_t capacity_29;
  ulong uStack_400;
  uint16_t _v_21;
  size_t body_size_27;
  size_t body_size_28;
  size_t local_3e8;
  size_t body_start_28;
  size_t capacity_28;
  size_t body_start_27;
  size_t capacity_27;
  ulong uStack_3c0;
  uint16_t _v_20;
  size_t body_size_25;
  size_t body_size_26;
  size_t body_start_26;
  size_t capacity_26;
  size_t body_start_25;
  size_t capacity_25;
  ulong uStack_388;
  uint16_t _v_19;
  size_t body_size_23;
  size_t body_size_24;
  size_t sStack_370;
  uint16_t _v_18;
  size_t body_start_24;
  size_t capacity_24;
  ptls_key_exchange_algorithm_t **algo_1;
  size_t body_start_23;
  size_t capacity_23;
  ulong uStack_340;
  uint16_t _v_17;
  size_t body_size_22;
  size_t body_start_22;
  size_t capacity_22;
  ulong uStack_320;
  uint16_t _v_16;
  size_t body_size_20;
  size_t body_size_21;
  long lStack_308;
  uint16_t _v_15;
  size_t i_1;
  size_t body_start_21;
  size_t capacity_21;
  size_t body_start_20;
  size_t capacity_20;
  ulong uStack_2d8;
  uint16_t _v_14;
  size_t body_size_18;
  size_t body_size_19;
  short *psStack_2c0;
  uint16_t _v_13;
  uint16_t *algo;
  size_t body_start_19;
  size_t capacity_19;
  size_t body_start_18;
  size_t capacity_18;
  ulong uStack_290;
  uint16_t _v_12;
  size_t body_size_15;
  size_t body_size_16;
  size_t body_size_17;
  ptls_iovec_t p;
  size_t body_start_17;
  size_t capacity_17;
  size_t i;
  size_t body_start_16;
  size_t capacity_16;
  size_t body_start_15;
  size_t capacity_15;
  ulong uStack_228;
  uint16_t _v_11;
  size_t body_size_14;
  size_t body_start_14;
  size_t capacity_14;
  ulong uStack_208;
  uint16_t _v_10;
  size_t body_size_12;
  size_t body_size_13;
  size_t body_start_13;
  size_t capacity_13;
  size_t body_start_12;
  size_t capacity_12;
  ulong uStack_1d0;
  uint16_t _v_9;
  size_t body_size_10;
  size_t body_size_11;
  size_t sStack_1b8;
  uint16_t _v_8;
  size_t body_start_11;
  size_t capacity_11;
  size_t body_start_10;
  size_t capacity_10;
  ulong uStack_190;
  uint16_t _v_7;
  size_t body_size_9;
  size_t body_start_9;
  size_t capacity_9;
  ulong uStack_170;
  uint16_t _v_6;
  size_t body_size_8;
  size_t local_160;
  size_t body_start_8;
  size_t capacity_8;
  ulong uStack_148;
  uint16_t _v_5;
  size_t body_size_5;
  size_t body_size_7;
  size_t body_start_7;
  size_t capacity_7;
  size_t body_size_6;
  size_t body_start_6;
  size_t capacity_6;
  uint16_t local_108;
  undefined1 local_106;
  undefined1 local_105;
  uint16_t local_104;
  undefined1 local_101;
  uint16_t _v_4;
  uint16_t _v_3;
  size_t ext_payload_from;
  size_t body_start_5;
  size_t capacity_5;
  size_t sStack_e0;
  uint16_t _v_2;
  size_t body_start_4;
  size_t capacity_4;
  size_t body_size_3;
  size_t local_c0;
  size_t body_start_3;
  size_t capacity_3;
  size_t body_size_2;
  long *plStack_a0;
  uint16_t _v_1;
  ptls_cipher_suite_t **cs;
  size_t body_start_2;
  size_t capacity_2;
  size_t body_size_1;
  size_t body_start_1;
  size_t capacity_1;
  long lStack_68;
  uint16_t _v;
  size_t body_start;
  size_t capacity;
  size_t local_50;
  size_t mess_start;
  ptls_key_schedule_t *_key_sched;
  ptls_buffer_t *_buf;
  void *pvStack_30;
  int ret;
  void *client_random_local;
  ptls_handshake_properties_t *properties_local;
  int is_second_flight_local;
  encode_ch_mode mode_local;
  ptls_buffer_t *sendbuf_local;
  ptls_context_t *ctx_local;
  
  pvStack_30 = client_random;
  client_random_local = properties;
  properties_local._0_4_ = is_second_flight;
  properties_local._4_4_ = mode;
  _is_second_flight_local = sendbuf;
  sendbuf_local = (ptls_buffer_t *)ctx;
  if ((mode != ENCODE_CH_MODE_INNER) && (ech == (st_ptls_ech_t *)0x0)) {
    __assert_fail("mode == ENCODE_CH_MODE_INNER || ech != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                  ,0x86d,
                  "int encode_client_hello(ptls_context_t *, ptls_buffer_t *, enum encode_ch_mode, int, ptls_handshake_properties_t *, const void *, ptls_key_exchange_context_t *, const char *, ptls_iovec_t, struct st_ptls_ech_t *, size_t *, ptls_iovec_t, ptls_iovec_t, ptls_iovec_t, uint32_t, size_t, ptls_iovec_t *, int)"
                 );
  }
  mess_start = 0;
  local_50 = sendbuf->off;
  capacity._7_1_ = 1;
  _key_sched = (ptls_key_schedule_t *)sendbuf;
  _buf._4_4_ = ptls_buffer__do_pushv(sendbuf,(void *)((long)&capacity + 7),1);
  if (_buf._4_4_ != 0) {
    return _buf._4_4_;
  }
  body_start = 3;
  _buf._4_4_ = ptls_buffer__do_pushv((ptls_buffer_t *)_key_sched,"",3);
  if (_buf._4_4_ != 0) {
    return _buf._4_4_;
  }
  lStack_68 = *(long *)(_key_sched->secret + 0xc);
  capacity_1._6_2_ = 0x303;
  capacity_1._4_1_ = 3;
  capacity_1._5_1_ = 3;
  _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,(void *)((long)&capacity_1 + 4),2);
  if (_buf._4_4_ != 0) {
    return _buf._4_4_;
  }
  _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,pvStack_30,0x20);
  if (_buf._4_4_ != 0) {
    return _buf._4_4_;
  }
  body_start_1 = 1;
  _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",1);
  if (_buf._4_4_ != 0) {
    return _buf._4_4_;
  }
  body_size_1 = _is_second_flight_local->off;
  if (properties_local._4_4_ != ENCODE_CH_MODE_ENCODED_INNER) {
    iVar1 = ptls_buffer__do_pushv
                      (_is_second_flight_local,legacy_session_id.base,legacy_session_id.len);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  _buf._4_4_ = 0;
  capacity_2 = _is_second_flight_local->off - body_size_1;
  if (body_start_1 == 0xffffffffffffffff) {
    iVar1 = ptls_buffer__adjust_quic_blocksize(_is_second_flight_local,capacity_2);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  else {
    if ((body_start_1 < 8) && ((ulong)(1L << ((byte)(body_start_1 << 3) & 0x3f)) <= capacity_2)) {
      return 0x20c;
    }
    for (; body_start_1 != 0; body_start_1 = body_start_1 - 1) {
      _is_second_flight_local->base[body_size_1 - body_start_1] =
           (uint8_t)(capacity_2 >> (((char)body_start_1 + -1) * '\b' & 0x3fU));
    }
  }
  _buf._4_4_ = 0;
  body_start_2 = 2;
  iVar1 = ptls_buffer__do_pushv(_is_second_flight_local,"",2);
  if (iVar1 != 0) {
    return iVar1;
  }
  cs = (ptls_cipher_suite_t **)_is_second_flight_local->off;
  for (plStack_a0 = *(long **)&sendbuf_local->is_allocated; _buf._4_4_ = 0, *plStack_a0 != 0;
      plStack_a0 = plStack_a0 + 1) {
    body_size_2._6_2_ = *(undefined2 *)*plStack_a0;
    body_size_2._4_1_ = (undefined1)((ushort)body_size_2._6_2_ >> 8);
    body_size_2._5_1_ = (undefined1)body_size_2._6_2_;
    iVar1 = ptls_buffer__do_pushv(_is_second_flight_local,(void *)((long)&body_size_2 + 4),2);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  capacity_3 = _is_second_flight_local->off - (long)cs;
  if (body_start_2 == 0xffffffffffffffff) {
    iVar1 = ptls_buffer__adjust_quic_blocksize(_is_second_flight_local,capacity_3);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  else {
    if ((body_start_2 < 8) && ((ulong)(1L << ((byte)(body_start_2 << 3) & 0x3f)) <= capacity_3)) {
      return 0x20c;
    }
    for (; body_start_2 != 0; body_start_2 = body_start_2 - 1) {
      *(char *)((long)cs + ((long)_is_second_flight_local->base - body_start_2)) =
           (char)(capacity_3 >> (((char)body_start_2 + -1) * '\b' & 0x3fU));
    }
  }
  _buf._4_4_ = 0;
  body_start_3 = 1;
  _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",1);
  if (_buf._4_4_ != 0) {
    return _buf._4_4_;
  }
  local_c0 = _is_second_flight_local->off;
  body_size_3._7_1_ = 0;
  _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,(void *)((long)&body_size_3 + 7),1);
  if (_buf._4_4_ != 0) {
    return _buf._4_4_;
  }
  capacity_4 = _is_second_flight_local->off - local_c0;
  if (body_start_3 == 0xffffffffffffffff) {
    iVar1 = ptls_buffer__adjust_quic_blocksize(_is_second_flight_local,capacity_4);
    if (iVar1 != 0) {
      return iVar1;
    }
  }
  else {
    if ((body_start_3 < 8) && ((ulong)(1L << ((byte)(body_start_3 << 3) & 0x3f)) <= capacity_4)) {
      return 0x20c;
    }
    for (; body_start_3 != 0; body_start_3 = body_start_3 - 1) {
      _is_second_flight_local->base[local_c0 - body_start_3] =
           (uint8_t)(capacity_4 >> (((char)body_start_3 + -1) * '\b' & 0x3fU));
    }
  }
  _buf._4_4_ = 0;
  body_start_4 = 2;
  _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",2);
  if (_buf._4_4_ != 0) {
    return _buf._4_4_;
  }
  sStack_e0 = _is_second_flight_local->off;
  if (properties_local._4_4_ == ENCODE_CH_MODE_OUTER) {
    capacity_5._6_2_ = 0xfe0d;
    capacity_5._4_1_ = 0xfe;
    capacity_5._5_1_ = 0xd;
    _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,(void *)((long)&capacity_5 + 4),2);
    if (_buf._4_4_ != 0) {
      return _buf._4_4_;
    }
    body_start_5 = 2;
    _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",2);
    if (_buf._4_4_ != 0) {
      return _buf._4_4_;
    }
    ext_payload_from = _is_second_flight_local->off;
    __v_4 = _is_second_flight_local->off;
    local_101 = 0;
    _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,&local_101,1);
    if (_buf._4_4_ != 0) {
      return _buf._4_4_;
    }
    local_104 = (ech->cipher->id).kdf;
    local_106 = (undefined1)(local_104 >> 8);
    local_105 = (undefined1)local_104;
    _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,&local_106,2);
    if (_buf._4_4_ != 0) {
      return _buf._4_4_;
    }
    local_108 = (ech->cipher->id).aead;
    capacity_6._6_1_ = (undefined1)(local_108 >> 8);
    capacity_6._7_1_ = (undefined1)local_108;
    _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,(void *)((long)&capacity_6 + 6),2);
    if (_buf._4_4_ != 0) {
      return _buf._4_4_;
    }
    capacity_6._5_1_ = ech->config_id;
    _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,(void *)((long)&capacity_6 + 5),1);
    if (_buf._4_4_ != 0) {
      return _buf._4_4_;
    }
    body_start_6 = 2;
    _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",2);
    if (_buf._4_4_ != 0) {
      return _buf._4_4_;
    }
    body_size_6 = _is_second_flight_local->off;
    if (((int)properties_local == 0) &&
       (iVar1 = ptls_buffer__do_pushv
                          (_is_second_flight_local,(ech->client).enc.base,(ech->client).enc.len),
       iVar1 != 0)) {
      return iVar1;
    }
    _buf._4_4_ = 0;
    capacity_7 = _is_second_flight_local->off - body_size_6;
    if (body_start_6 == 0xffffffffffffffff) {
      iVar1 = ptls_buffer__adjust_quic_blocksize(_is_second_flight_local,capacity_7);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    else {
      if ((body_start_6 < 8) && ((ulong)(1L << ((byte)(body_start_6 << 3) & 0x3f)) <= capacity_7)) {
        return 0x20c;
      }
      for (; body_start_6 != 0; body_start_6 = body_start_6 - 1) {
        _is_second_flight_local->base[body_size_6 - body_start_6] =
             (uint8_t)(capacity_7 >> (((char)body_start_6 + -1) * '\b' & 0x3fU));
      }
    }
    _buf._4_4_ = 0;
    body_start_7 = 2;
    _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",2);
    if (_buf._4_4_ != 0) {
      return _buf._4_4_;
    }
    body_size_7 = _is_second_flight_local->off;
    sVar2 = _is_second_flight_local->off - __v_4;
    if ((int)properties_local == 0) {
      local_5d8 = (ech->client).enc.len;
    }
    else {
      local_5d8 = 0;
    }
    sVar3 = outer_ech_header_size(local_5d8);
    if (sVar2 != sVar3) {
      __assert_fail("sendbuf->off - ext_payload_from == outer_ech_header_size(is_second_flight ? 0 : ech->client.enc.len)"
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                    ,0x890,
                    "int encode_client_hello(ptls_context_t *, ptls_buffer_t *, enum encode_ch_mode, int, ptls_handshake_properties_t *, const void *, ptls_key_exchange_context_t *, const char *, ptls_iovec_t, struct st_ptls_ech_t *, size_t *, ptls_iovec_t, ptls_iovec_t, ptls_iovec_t, uint32_t, size_t, ptls_iovec_t *, int)"
                   );
    }
    _buf._4_4_ = ptls_buffer_reserve(_is_second_flight_local,*ech_size_offset);
    if (_buf._4_4_ != 0) {
      return _buf._4_4_;
    }
    memset(_is_second_flight_local->base + _is_second_flight_local->off,0,*ech_size_offset);
    _is_second_flight_local->off = *ech_size_offset + _is_second_flight_local->off;
    *ech_size_offset = _is_second_flight_local->off - *ech_size_offset;
    body_size_5 = _is_second_flight_local->off - body_size_7;
    if (body_start_7 == 0xffffffffffffffff) {
      iVar1 = ptls_buffer__adjust_quic_blocksize(_is_second_flight_local,body_size_5);
      if (iVar1 != 0) {
        return iVar1;
      }
      _buf._4_4_ = 0;
    }
    else {
      if ((body_start_7 < 8) && ((ulong)(1L << ((byte)(body_start_7 << 3) & 0x3f)) <= body_size_5))
      {
        return 0x20c;
      }
      for (; body_start_7 != 0; body_start_7 = body_start_7 - 1) {
        _is_second_flight_local->base[body_size_7 - body_start_7] =
             (uint8_t)(body_size_5 >> (((char)body_start_7 + -1) * '\b' & 0x3fU));
      }
    }
    uStack_148 = _is_second_flight_local->off - ext_payload_from;
    if (body_start_5 == 0xffffffffffffffff) {
      iVar1 = ptls_buffer__adjust_quic_blocksize(_is_second_flight_local,uStack_148);
      if (iVar1 != 0) {
        return iVar1;
      }
      _buf._4_4_ = 0;
    }
    else {
      if ((body_start_5 < 8) && ((ulong)(1L << ((byte)(body_start_5 << 3) & 0x3f)) <= uStack_148)) {
        return 0x20c;
      }
      for (; body_start_5 != 0; body_start_5 = body_start_5 - 1) {
        _is_second_flight_local->base[ext_payload_from - body_start_5] =
             (uint8_t)(uStack_148 >> (((char)body_start_5 + -1) * '\b' & 0x3fU));
      }
    }
    goto LAB_00126d69;
  }
  if (ech->aead == (ptls_aead_context_t *)0x0) {
    if (ech_replay.base != (uint8_t *)0x0) {
      capacity_9._6_2_ = 0xfe0d;
      capacity_9._4_1_ = 0xfe;
      capacity_9._5_1_ = 0xd;
      _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,(void *)((long)&capacity_9 + 4),2);
      if (_buf._4_4_ != 0) {
        return _buf._4_4_;
      }
      body_start_9 = 2;
      _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",2);
      if (_buf._4_4_ != 0) {
        return _buf._4_4_;
      }
      body_size_9 = _is_second_flight_local->off;
      _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,ech_replay.base,ech_replay.len);
      if (_buf._4_4_ != 0) {
        return _buf._4_4_;
      }
      uStack_190 = _is_second_flight_local->off - body_size_9;
      if (body_start_9 == 0xffffffffffffffff) {
        iVar1 = ptls_buffer__adjust_quic_blocksize(_is_second_flight_local,uStack_190);
        goto joined_r0x00126d56;
      }
      if ((body_start_9 < 8) && ((ulong)(1L << ((byte)(body_start_9 << 3) & 0x3f)) <= uStack_190)) {
        return 0x20c;
      }
      for (; body_start_9 != 0; body_start_9 = body_start_9 - 1) {
        _is_second_flight_local->base[body_size_9 - body_start_9] =
             (uint8_t)(uStack_190 >> (((char)body_start_9 + -1) * '\b' & 0x3fU));
      }
    }
  }
  else {
    capacity_8._6_2_ = 0xfe0d;
    capacity_8._4_1_ = 0xfe;
    capacity_8._5_1_ = 0xd;
    _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,(void *)((long)&capacity_8 + 4),2);
    if (_buf._4_4_ != 0) {
      return _buf._4_4_;
    }
    body_start_8 = 2;
    _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",2);
    if (_buf._4_4_ != 0) {
      return _buf._4_4_;
    }
    local_160 = _is_second_flight_local->off;
    body_size_8._7_1_ = 1;
    _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,(void *)((long)&body_size_8 + 7),1);
    if (_buf._4_4_ != 0) {
      return _buf._4_4_;
    }
    uStack_170 = _is_second_flight_local->off - local_160;
    if (body_start_8 == 0xffffffffffffffff) {
      iVar1 = ptls_buffer__adjust_quic_blocksize(_is_second_flight_local,uStack_170);
joined_r0x00126d56:
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    else {
      if ((body_start_8 < 8) && ((ulong)(1L << ((byte)(body_start_8 << 3) & 0x3f)) <= uStack_170)) {
        return 0x20c;
      }
      for (; body_start_8 != 0; body_start_8 = body_start_8 - 1) {
        _is_second_flight_local->base[local_160 - body_start_8] =
             (uint8_t)(uStack_170 >> (((char)body_start_8 + -1) * '\b' & 0x3fU));
      }
    }
  }
  _buf._4_4_ = 0;
LAB_00126d69:
  if (properties_local._4_4_ == ENCODE_CH_MODE_ENCODED_INNER) {
    capacity_10._6_2_ = 0xfd00;
    capacity_10._4_1_ = 0xfd;
    capacity_10._5_1_ = 0;
    _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,(void *)((long)&capacity_10 + 4),2);
    if (_buf._4_4_ != 0) {
      return _buf._4_4_;
    }
    body_start_10 = 2;
    _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",2);
    if (_buf._4_4_ != 0) {
      return _buf._4_4_;
    }
    capacity_11 = _is_second_flight_local->off;
    body_start_11 = 1;
    _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",1);
    if (_buf._4_4_ != 0) {
      return _buf._4_4_;
    }
    sStack_1b8 = _is_second_flight_local->off;
    body_size_11._6_2_ = 0x33;
    body_size_11._4_1_ = 0;
    body_size_11._5_1_ = 0x33;
    _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,(void *)((long)&body_size_11 + 4),2);
    if (_buf._4_4_ != 0) {
      return _buf._4_4_;
    }
    body_size_10 = _is_second_flight_local->off - sStack_1b8;
    if (body_start_11 == 0xffffffffffffffff) {
      iVar1 = ptls_buffer__adjust_quic_blocksize(_is_second_flight_local,body_size_10);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    else {
      if ((body_start_11 < 8) &&
         ((ulong)(1L << ((byte)(body_start_11 << 3) & 0x3f)) <= body_size_10)) {
        return 0x20c;
      }
      for (; body_start_11 != 0; body_start_11 = body_start_11 - 1) {
        _is_second_flight_local->base[sStack_1b8 - body_start_11] =
             (uint8_t)(body_size_10 >> (((char)body_start_11 + -1) * '\b' & 0x3fU));
      }
    }
    _buf._4_4_ = 0;
    uStack_1d0 = _is_second_flight_local->off - capacity_11;
    if (body_start_10 == 0xffffffffffffffff) {
      iVar1 = ptls_buffer__adjust_quic_blocksize(_is_second_flight_local,uStack_1d0);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    else {
      if ((body_start_10 < 8) && ((ulong)(1L << ((byte)(body_start_10 << 3) & 0x3f)) <= uStack_1d0))
      {
        return 0x20c;
      }
      for (; body_start_10 != 0; body_start_10 = body_start_10 - 1) {
        _is_second_flight_local->base[capacity_11 - body_start_10] =
             (uint8_t)(uStack_1d0 >> (((char)body_start_10 + -1) * '\b' & 0x3fU));
      }
    }
    _buf._4_4_ = 0;
  }
  else {
    capacity_12._6_2_ = 0x33;
    capacity_12._4_1_ = 0;
    capacity_12._5_1_ = 0x33;
    _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,(void *)((long)&capacity_12 + 4),2);
    if (_buf._4_4_ != 0) {
      return _buf._4_4_;
    }
    body_start_12 = 2;
    _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",2);
    if (_buf._4_4_ != 0) {
      return _buf._4_4_;
    }
    capacity_13 = _is_second_flight_local->off;
    body_start_13 = 2;
    _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",2);
    if (_buf._4_4_ != 0) {
      return _buf._4_4_;
    }
    body_size_13 = _is_second_flight_local->off;
    iVar1 = 0;
    if ((key_share_ctx != (ptls_key_exchange_context_t *)0x0) &&
       (iVar1 = push_key_share_entry
                          (_is_second_flight_local,key_share_ctx->algo->id,key_share_ctx->pubkey),
       iVar1 != 0)) {
      return iVar1;
    }
    _buf._4_4_ = iVar1;
    body_size_12 = _is_second_flight_local->off - body_size_13;
    if (body_start_13 == 0xffffffffffffffff) {
      iVar1 = ptls_buffer__adjust_quic_blocksize(_is_second_flight_local,body_size_12);
      if (iVar1 != 0) {
        return iVar1;
      }
      _buf._4_4_ = 0;
    }
    else {
      if ((body_start_13 < 8) &&
         ((ulong)(1L << ((byte)(body_start_13 << 3) & 0x3f)) <= body_size_12)) {
        return 0x20c;
      }
      for (; body_start_13 != 0; body_start_13 = body_start_13 - 1) {
        _is_second_flight_local->base[body_size_13 - body_start_13] =
             (uint8_t)(body_size_12 >> (((char)body_start_13 + -1) * '\b' & 0x3fU));
      }
    }
    uStack_208 = _is_second_flight_local->off - capacity_13;
    if (body_start_12 == 0xffffffffffffffff) {
      iVar1 = ptls_buffer__adjust_quic_blocksize(_is_second_flight_local,uStack_208);
      if (iVar1 != 0) {
        return iVar1;
      }
      _buf._4_4_ = 0;
    }
    else {
      if ((body_start_12 < 8) && ((ulong)(1L << ((byte)(body_start_12 << 3) & 0x3f)) <= uStack_208))
      {
        return 0x20c;
      }
      for (; body_start_12 != 0; body_start_12 = body_start_12 - 1) {
        _is_second_flight_local->base[capacity_13 - body_start_12] =
             (uint8_t)(uStack_208 >> (((char)body_start_12 + -1) * '\b' & 0x3fU));
      }
    }
  }
  if (sni_name != (char *)0x0) {
    capacity_14._6_2_ = 0;
    capacity_14._4_1_ = 0;
    capacity_14._5_1_ = 0;
    _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,(void *)((long)&capacity_14 + 4),2);
    if (_buf._4_4_ != 0) {
      return _buf._4_4_;
    }
    body_start_14 = 2;
    _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",2);
    if (_buf._4_4_ != 0) {
      return _buf._4_4_;
    }
    body_size_14 = _is_second_flight_local->off;
    _buf._4_4_ = emit_server_name_extension(_is_second_flight_local,sni_name);
    if (_buf._4_4_ != 0) {
      return _buf._4_4_;
    }
    uStack_228 = _is_second_flight_local->off - body_size_14;
    if (body_start_14 == 0xffffffffffffffff) {
      iVar1 = ptls_buffer__adjust_quic_blocksize(_is_second_flight_local,uStack_228);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    else {
      if ((body_start_14 < 8) && ((ulong)(1L << ((byte)(body_start_14 << 3) & 0x3f)) <= uStack_228))
      {
        return 0x20c;
      }
      for (; body_start_14 != 0; body_start_14 = body_start_14 - 1) {
        _is_second_flight_local->base[body_size_14 - body_start_14] =
             (uint8_t)(uStack_228 >> (((char)body_start_14 + -1) * '\b' & 0x3fU));
      }
    }
    _buf._4_4_ = 0;
  }
  if ((client_random_local != (void *)0x0) && (*(long *)((long)client_random_local + 8) != 0)) {
    capacity_15._6_2_ = 0x10;
    capacity_15._4_1_ = 0;
    capacity_15._5_1_ = 0x10;
    _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,(void *)((long)&capacity_15 + 4),2);
    if (_buf._4_4_ != 0) {
      return _buf._4_4_;
    }
    body_start_15 = 2;
    _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",2);
    if (_buf._4_4_ != 0) {
      return _buf._4_4_;
    }
    sVar2 = _is_second_flight_local->off;
    body_start_16 = 2;
    iVar1 = ptls_buffer__do_pushv(_is_second_flight_local,"",2);
    if (iVar1 != 0) {
      return iVar1;
    }
    sVar3 = _is_second_flight_local->off;
    for (capacity_17 = 0; _buf._4_4_ = 0, capacity_17 != *(size_t *)((long)client_random_local + 8);
        capacity_17 = capacity_17 + 1) {
      body_start_17 = 1;
      _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",1);
      if (_buf._4_4_ != 0) {
        return _buf._4_4_;
      }
      p.len = _is_second_flight_local->off;
      puVar4 = (undefined8 *)(*client_random_local + capacity_17 * 0x10);
      body_size_17 = *puVar4;
      p.base = (uint8_t *)puVar4[1];
      iVar1 = ptls_buffer__do_pushv(_is_second_flight_local,(void *)body_size_17,(size_t)p.base);
      if (iVar1 != 0) {
        return iVar1;
      }
      body_size_16 = _is_second_flight_local->off - p.len;
      if (0xff < body_size_16) {
        return 0x20c;
      }
      for (; body_start_17 != 0; body_start_17 = body_start_17 - 1) {
        _is_second_flight_local->base[p.len - body_start_17] =
             (uint8_t)(body_size_16 >> (((char)body_start_17 + -1) * '\b' & 0x3fU));
      }
    }
    body_size_15 = _is_second_flight_local->off - sVar3;
    if (0xffff < body_size_15) {
      return 0x20c;
    }
    for (; body_start_16 != 0; body_start_16 = body_start_16 - 1) {
      _is_second_flight_local->base[sVar3 - body_start_16] =
           (uint8_t)(body_size_15 >> (((char)body_start_16 + -1) * '\b' & 0x3fU));
    }
    uStack_290 = _is_second_flight_local->off - sVar2;
    if (0xffff < uStack_290) {
      return 0x20c;
    }
    for (; body_start_15 != 0; body_start_15 = body_start_15 - 1) {
      _is_second_flight_local->base[sVar2 - body_start_15] =
           (uint8_t)(uStack_290 >> (((char)body_start_15 + -1) * '\b' & 0x3fU));
    }
  }
  if (sendbuf_local[7].capacity != 0) {
    capacity_18._6_2_ = 0x1b;
    capacity_18._4_1_ = 0;
    capacity_18._5_1_ = 0x1b;
    _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,(void *)((long)&capacity_18 + 4),2);
    if (_buf._4_4_ != 0) {
      return _buf._4_4_;
    }
    body_start_18 = 2;
    _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",2);
    if (_buf._4_4_ != 0) {
      return _buf._4_4_;
    }
    capacity_19 = _is_second_flight_local->off;
    body_start_19 = 1;
    _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",1);
    if (_buf._4_4_ != 0) {
      return _buf._4_4_;
    }
    algo = (uint16_t *)_is_second_flight_local->off;
    psStack_2c0 = *(short **)sendbuf_local[7].capacity;
    if (*psStack_2c0 == -1) {
      __assert_fail("*algo != UINT16_MAX",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/picotls.c"
                    ,0x8c3,
                    "int encode_client_hello(ptls_context_t *, ptls_buffer_t *, enum encode_ch_mode, int, ptls_handshake_properties_t *, const void *, ptls_key_exchange_context_t *, const char *, ptls_iovec_t, struct st_ptls_ech_t *, size_t *, ptls_iovec_t, ptls_iovec_t, ptls_iovec_t, uint32_t, size_t, ptls_iovec_t *, int)"
                   );
    }
    for (; _buf._4_4_ = 0, *psStack_2c0 != -1; psStack_2c0 = psStack_2c0 + 1) {
      body_size_19._6_2_ = *psStack_2c0;
      body_size_19._4_1_ = (undefined1)((ushort)body_size_19._6_2_ >> 8);
      body_size_19._5_1_ = (undefined1)body_size_19._6_2_;
      iVar1 = ptls_buffer__do_pushv(_is_second_flight_local,(void *)((long)&body_size_19 + 4),2);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    body_size_18 = _is_second_flight_local->off - (long)algo;
    if (body_start_19 == 0xffffffffffffffff) {
      iVar1 = ptls_buffer__adjust_quic_blocksize(_is_second_flight_local,body_size_18);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    else {
      if ((body_start_19 < 8) &&
         ((ulong)(1L << ((byte)(body_start_19 << 3) & 0x3f)) <= body_size_18)) {
        return 0x20c;
      }
      for (; body_start_19 != 0; body_start_19 = body_start_19 - 1) {
        *(char *)((long)algo + ((long)_is_second_flight_local->base - body_start_19)) =
             (char)(body_size_18 >> (((char)body_start_19 + -1) * '\b' & 0x3fU));
      }
    }
    _buf._4_4_ = 0;
    uStack_2d8 = _is_second_flight_local->off - capacity_19;
    if (body_start_18 == 0xffffffffffffffff) {
      iVar1 = ptls_buffer__adjust_quic_blocksize(_is_second_flight_local,uStack_2d8);
      if (iVar1 != 0) {
        return iVar1;
      }
    }
    else {
      if ((body_start_18 < 8) && ((ulong)(1L << ((byte)(body_start_18 << 3) & 0x3f)) <= uStack_2d8))
      {
        return 0x20c;
      }
      for (; body_start_18 != 0; body_start_18 = body_start_18 - 1) {
        _is_second_flight_local->base[capacity_19 - body_start_18] =
             (uint8_t)(uStack_2d8 >> (((char)body_start_18 + -1) * '\b' & 0x3fU));
      }
    }
    _buf._4_4_ = 0;
  }
  capacity_20._6_2_ = 0x2b;
  capacity_20._4_1_ = 0;
  capacity_20._5_1_ = 0x2b;
  _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,(void *)((long)&capacity_20 + 4),2);
  if (_buf._4_4_ == 0) {
    body_start_20 = 2;
    _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",2);
    if (_buf._4_4_ == 0) {
      capacity_21 = _is_second_flight_local->off;
      body_start_21 = 1;
      _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",1);
      if (_buf._4_4_ == 0) {
        i_1 = _is_second_flight_local->off;
        for (lStack_308 = 0; _buf._4_4_ = 0, lStack_308 != 1; lStack_308 = lStack_308 + 1) {
          body_size_21._6_2_ = supported_versions[lStack_308];
          body_size_21._4_1_ = (undefined1)(body_size_21._6_2_ >> 8);
          body_size_21._5_1_ = (undefined1)body_size_21._6_2_;
          iVar1 = ptls_buffer__do_pushv(_is_second_flight_local,(void *)((long)&body_size_21 + 4),2)
          ;
          if (iVar1 != 0) {
            return iVar1;
          }
        }
        body_size_20 = _is_second_flight_local->off - i_1;
        if (body_start_21 == 0xffffffffffffffff) {
          iVar1 = ptls_buffer__adjust_quic_blocksize(_is_second_flight_local,body_size_20);
          if (iVar1 != 0) {
            return iVar1;
          }
        }
        else {
          if ((body_start_21 < 8) &&
             ((ulong)(1L << ((byte)(body_start_21 << 3) & 0x3f)) <= body_size_20)) {
            return 0x20c;
          }
          for (; body_start_21 != 0; body_start_21 = body_start_21 - 1) {
            _is_second_flight_local->base[i_1 - body_start_21] =
                 (uint8_t)(body_size_20 >> (((char)body_start_21 + -1) * '\b' & 0x3fU));
          }
        }
        _buf._4_4_ = 0;
        uStack_320 = _is_second_flight_local->off - capacity_21;
        if (body_start_20 == 0xffffffffffffffff) {
          iVar1 = ptls_buffer__adjust_quic_blocksize(_is_second_flight_local,uStack_320);
          if (iVar1 != 0) {
            return iVar1;
          }
        }
        else {
          if ((body_start_20 < 8) &&
             ((ulong)(1L << ((byte)(body_start_20 << 3) & 0x3f)) <= uStack_320)) {
            return 0x20c;
          }
          for (; body_start_20 != 0; body_start_20 = body_start_20 - 1) {
            _is_second_flight_local->base[capacity_21 - body_start_20] =
                 (uint8_t)(uStack_320 >> (((char)body_start_20 + -1) * '\b' & 0x3fU));
          }
        }
        _buf._4_4_ = 0;
        capacity_22._6_2_ = 0xd;
        capacity_22._4_1_ = 0;
        capacity_22._5_1_ = 0xd;
        _buf._4_4_ = ptls_buffer__do_pushv
                               (_is_second_flight_local,(void *)((long)&capacity_22 + 4),2);
        if (_buf._4_4_ == 0) {
          body_start_22 = 2;
          _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",2);
          if (_buf._4_4_ == 0) {
            body_size_22 = _is_second_flight_local->off;
            _buf._4_4_ = push_signature_algorithms
                                   (*(ptls_verify_certificate_t **)&sendbuf_local[4].is_allocated,
                                    _is_second_flight_local);
            if (_buf._4_4_ == 0) {
              uStack_340 = _is_second_flight_local->off - body_size_22;
              if (body_start_22 == 0xffffffffffffffff) {
                iVar1 = ptls_buffer__adjust_quic_blocksize(_is_second_flight_local,uStack_340);
                if (iVar1 != 0) {
                  return iVar1;
                }
              }
              else {
                if ((body_start_22 < 8) &&
                   ((ulong)(1L << ((byte)(body_start_22 << 3) & 0x3f)) <= uStack_340)) {
                  return 0x20c;
                }
                for (; body_start_22 != 0; body_start_22 = body_start_22 - 1) {
                  _is_second_flight_local->base[body_size_22 - body_start_22] =
                       (uint8_t)(uStack_340 >> (((char)body_start_22 + -1) * '\b' & 0x3fU));
                }
              }
              _buf._4_4_ = 0;
              if (sendbuf_local->off != 0) {
                capacity_23._6_2_ = 10;
                capacity_23._4_1_ = 0;
                capacity_23._5_1_ = 10;
                _buf._4_4_ = ptls_buffer__do_pushv
                                       (_is_second_flight_local,(void *)((long)&capacity_23 + 4),2);
                if (_buf._4_4_ != 0) {
                  return _buf._4_4_;
                }
                body_start_23 = 2;
                _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",2);
                if (_buf._4_4_ != 0) {
                  return _buf._4_4_;
                }
                algo_1 = (ptls_key_exchange_algorithm_t **)_is_second_flight_local->off;
                capacity_24 = sendbuf_local->off;
                body_start_24 = 2;
                iVar1 = ptls_buffer__do_pushv(_is_second_flight_local,"",2);
                if (iVar1 != 0) {
                  return iVar1;
                }
                sStack_370 = _is_second_flight_local->off;
                for (; _buf._4_4_ = 0, *(long *)capacity_24 != 0; capacity_24 = capacity_24 + 8) {
                  body_size_24._6_2_ = **(undefined2 **)capacity_24;
                  body_size_24._4_1_ = (undefined1)((ushort)body_size_24._6_2_ >> 8);
                  body_size_24._5_1_ = (undefined1)body_size_24._6_2_;
                  iVar1 = ptls_buffer__do_pushv
                                    (_is_second_flight_local,(void *)((long)&body_size_24 + 4),2);
                  if (iVar1 != 0) {
                    return iVar1;
                  }
                }
                body_size_23 = _is_second_flight_local->off - sStack_370;
                if (body_start_24 == 0xffffffffffffffff) {
                  iVar1 = ptls_buffer__adjust_quic_blocksize(_is_second_flight_local,body_size_23);
                  if (iVar1 != 0) {
                    return iVar1;
                  }
                }
                else {
                  if ((body_start_24 < 8) &&
                     ((ulong)(1L << ((byte)(body_start_24 << 3) & 0x3f)) <= body_size_23)) {
                    return 0x20c;
                  }
                  for (; body_start_24 != 0; body_start_24 = body_start_24 - 1) {
                    _is_second_flight_local->base[sStack_370 - body_start_24] =
                         (uint8_t)(body_size_23 >> (((char)body_start_24 + -1) * '\b' & 0x3fU));
                  }
                }
                _buf._4_4_ = 0;
                uStack_388 = _is_second_flight_local->off - (long)algo_1;
                if (body_start_23 == 0xffffffffffffffff) {
                  iVar1 = ptls_buffer__adjust_quic_blocksize(_is_second_flight_local,uStack_388);
                  if (iVar1 != 0) {
                    return iVar1;
                  }
                }
                else {
                  if ((body_start_23 < 8) &&
                     ((ulong)(1L << ((byte)(body_start_23 << 3) & 0x3f)) <= uStack_388)) {
                    return 0x20c;
                  }
                  for (; body_start_23 != 0; body_start_23 = body_start_23 - 1) {
                    *(char *)((long)algo_1 + ((long)_is_second_flight_local->base - body_start_23))
                         = (char)(uStack_388 >> (((char)body_start_23 + -1) * '\b' & 0x3fU));
                  }
                }
              }
              _buf._4_4_ = 0;
              if ((cookie != (ptls_iovec_t *)0x0) && (cookie->base != (uint8_t *)0x0)) {
                capacity_25._6_2_ = 0x2c;
                capacity_25._4_1_ = 0;
                capacity_25._5_1_ = 0x2c;
                _buf._4_4_ = ptls_buffer__do_pushv
                                       (_is_second_flight_local,(void *)((long)&capacity_25 + 4),2);
                if (_buf._4_4_ != 0) {
                  return _buf._4_4_;
                }
                body_start_25 = 2;
                _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",2);
                if (_buf._4_4_ != 0) {
                  return _buf._4_4_;
                }
                capacity_26 = _is_second_flight_local->off;
                body_start_26 = 2;
                _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",2);
                if (_buf._4_4_ != 0) {
                  return _buf._4_4_;
                }
                body_size_26 = _is_second_flight_local->off;
                _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,cookie->base,cookie->len)
                ;
                if (_buf._4_4_ != 0) {
                  return _buf._4_4_;
                }
                body_size_25 = _is_second_flight_local->off - body_size_26;
                if (body_start_26 == 0xffffffffffffffff) {
                  iVar1 = ptls_buffer__adjust_quic_blocksize(_is_second_flight_local,body_size_25);
                  if (iVar1 != 0) {
                    return iVar1;
                  }
                }
                else {
                  if ((body_start_26 < 8) &&
                     ((ulong)(1L << ((byte)(body_start_26 << 3) & 0x3f)) <= body_size_25)) {
                    return 0x20c;
                  }
                  for (; body_start_26 != 0; body_start_26 = body_start_26 - 1) {
                    _is_second_flight_local->base[body_size_26 - body_start_26] =
                         (uint8_t)(body_size_25 >> (((char)body_start_26 + -1) * '\b' & 0x3fU));
                  }
                }
                _buf._4_4_ = 0;
                uStack_3c0 = _is_second_flight_local->off - capacity_26;
                if (body_start_25 == 0xffffffffffffffff) {
                  iVar1 = ptls_buffer__adjust_quic_blocksize(_is_second_flight_local,uStack_3c0);
                  if (iVar1 != 0) {
                    return iVar1;
                  }
                }
                else {
                  if ((body_start_25 < 8) &&
                     ((ulong)(1L << ((byte)(body_start_25 << 3) & 0x3f)) <= uStack_3c0)) {
                    return 0x20c;
                  }
                  for (; body_start_25 != 0; body_start_25 = body_start_25 - 1) {
                    _is_second_flight_local->base[capacity_26 - body_start_25] =
                         (uint8_t)(uStack_3c0 >> (((char)body_start_25 + -1) * '\b' & 0x3fU));
                  }
                }
              }
              _buf._4_4_ = 0;
              if ((sendbuf_local[5].is_allocated >> 5 & 1) != 0) {
                capacity_27._6_2_ = 0x14;
                capacity_27._4_1_ = 0;
                capacity_27._5_1_ = 0x14;
                _buf._4_4_ = ptls_buffer__do_pushv
                                       (_is_second_flight_local,(void *)((long)&capacity_27 + 4),2);
                if (_buf._4_4_ != 0) {
                  return _buf._4_4_;
                }
                body_start_27 = 2;
                _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",2);
                if (_buf._4_4_ != 0) {
                  return _buf._4_4_;
                }
                capacity_28 = _is_second_flight_local->off;
                body_start_28 = 1;
                _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",1);
                if (_buf._4_4_ != 0) {
                  return _buf._4_4_;
                }
                local_3e8 = _is_second_flight_local->off;
                body_size_28._7_1_ = 2;
                _buf._4_4_ = ptls_buffer__do_pushv
                                       (_is_second_flight_local,(void *)((long)&body_size_28 + 7),1)
                ;
                if (_buf._4_4_ != 0) {
                  return _buf._4_4_;
                }
                body_size_27 = _is_second_flight_local->off - local_3e8;
                if (body_start_28 == 0xffffffffffffffff) {
                  iVar1 = ptls_buffer__adjust_quic_blocksize(_is_second_flight_local,body_size_27);
                  if (iVar1 != 0) {
                    return iVar1;
                  }
                }
                else {
                  if ((body_start_28 < 8) &&
                     ((ulong)(1L << ((byte)(body_start_28 << 3) & 0x3f)) <= body_size_27)) {
                    return 0x20c;
                  }
                  for (; body_start_28 != 0; body_start_28 = body_start_28 - 1) {
                    _is_second_flight_local->base[local_3e8 - body_start_28] =
                         (uint8_t)(body_size_27 >> (((char)body_start_28 + -1) * '\b' & 0x3fU));
                  }
                }
                _buf._4_4_ = 0;
                uStack_400 = _is_second_flight_local->off - capacity_28;
                if (body_start_27 == 0xffffffffffffffff) {
                  iVar1 = ptls_buffer__adjust_quic_blocksize(_is_second_flight_local,uStack_400);
                  if (iVar1 != 0) {
                    return iVar1;
                  }
                }
                else {
                  if ((body_start_27 < 8) &&
                     ((ulong)(1L << ((byte)(body_start_27 << 3) & 0x3f)) <= uStack_400)) {
                    return 0x20c;
                  }
                  for (; body_start_27 != 0; body_start_27 = body_start_27 - 1) {
                    _is_second_flight_local->base[capacity_28 - body_start_27] =
                         (uint8_t)(uStack_400 >> (((char)body_start_27 + -1) * '\b' & 0x3fU));
                  }
                }
              }
              _buf._4_4_ = 0;
              if ((sendbuf_local[6].capacity != 0) &&
                 ((sendbuf_local[9].is_allocated != '\0' || (sendbuf_local[9].align_bits != '\0'))))
              {
                capacity_29._6_2_ = 0x3a;
                capacity_29._4_1_ = 0;
                capacity_29._5_1_ = 0x3a;
                _buf._4_4_ = ptls_buffer__do_pushv
                                       (_is_second_flight_local,(void *)((long)&capacity_29 + 4),2);
                if (_buf._4_4_ != 0) {
                  return _buf._4_4_;
                }
                body_start_29 = 2;
                _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",2);
                if (_buf._4_4_ != 0) {
                  return _buf._4_4_;
                }
                local_418 = _is_second_flight_local->off;
                body_size_29._6_1_ = sendbuf_local[9].is_allocated;
                body_size_29._7_1_ = sendbuf_local[9].align_bits;
                _buf._4_4_ = ptls_buffer__do_pushv
                                       (_is_second_flight_local,(void *)((long)&body_size_29 + 6),2)
                ;
                if (_buf._4_4_ != 0) {
                  return _buf._4_4_;
                }
                uStack_428 = _is_second_flight_local->off - local_418;
                if (body_start_29 == 0xffffffffffffffff) {
                  iVar1 = ptls_buffer__adjust_quic_blocksize(_is_second_flight_local,uStack_428);
                  if (iVar1 != 0) {
                    return iVar1;
                  }
                }
                else {
                  if ((body_start_29 < 8) &&
                     ((ulong)(1L << ((byte)(body_start_29 << 3) & 0x3f)) <= uStack_428)) {
                    return 0x20c;
                  }
                  for (; body_start_29 != 0; body_start_29 = body_start_29 - 1) {
                    _is_second_flight_local->base[local_418 - body_start_29] =
                         (uint8_t)(uStack_428 >> (((char)body_start_29 + -1) * '\b' & 0x3fU));
                  }
                }
              }
              _buf._4_4_ = 0;
              _buf._4_4_ = push_additional_extensions
                                     ((ptls_handshake_properties_t *)client_random_local,
                                      _is_second_flight_local);
              if (_buf._4_4_ == 0) {
                if ((sendbuf_local[6].capacity != 0) || (psk_secret.base != (uint8_t *)0x0)) {
                  capacity_30._6_2_ = 0x2d;
                  capacity_30._4_1_ = 0;
                  capacity_30._5_1_ = 0x2d;
                  _buf._4_4_ = ptls_buffer__do_pushv
                                         (_is_second_flight_local,(void *)((long)&capacity_30 + 4),2
                                         );
                  if (_buf._4_4_ != 0) {
                    return _buf._4_4_;
                  }
                  body_start_30 = 2;
                  _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",2);
                  if (_buf._4_4_ != 0) {
                    return _buf._4_4_;
                  }
                  capacity_31 = _is_second_flight_local->off;
                  body_start_31 = 1;
                  _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",1);
                  if (_buf._4_4_ != 0) {
                    return _buf._4_4_;
                  }
                  local_450 = _is_second_flight_local->off;
                  if ((sendbuf_local[5].is_allocated & 1) == 0) {
                    body_size_31._7_1_ = 0;
                    iVar1 = ptls_buffer__do_pushv
                                      (_is_second_flight_local,(void *)((long)&body_size_31 + 7),1);
                    if (iVar1 != 0) {
                      return iVar1;
                    }
                  }
                  _buf._4_4_ = 0;
                  body_size_31._6_1_ = 1;
                  _buf._4_4_ = ptls_buffer__do_pushv
                                         (_is_second_flight_local,(void *)((long)&body_size_31 + 6),
                                          1);
                  if (_buf._4_4_ != 0) {
                    return _buf._4_4_;
                  }
                  body_size_30 = _is_second_flight_local->off - local_450;
                  if (body_start_31 == 0xffffffffffffffff) {
                    _buf._4_4_ = ptls_buffer__adjust_quic_blocksize
                                           (_is_second_flight_local,body_size_30);
                    if (_buf._4_4_ != 0) {
                      return _buf._4_4_;
                    }
                  }
                  else {
                    if ((body_start_31 < 8) &&
                       ((ulong)(1L << ((byte)(body_start_31 << 3) & 0x3f)) <= body_size_30)) {
                      return 0x20c;
                    }
                    for (; _buf._4_4_ = 0, body_start_31 != 0; body_start_31 = body_start_31 - 1) {
                      _is_second_flight_local->base[local_450 - body_start_31] =
                           (uint8_t)(body_size_30 >> (((char)body_start_31 + -1) * '\b' & 0x3fU));
                    }
                  }
                  uStack_468 = _is_second_flight_local->off - capacity_31;
                  if (body_start_30 == 0xffffffffffffffff) {
                    _buf._4_4_ = ptls_buffer__adjust_quic_blocksize
                                           (_is_second_flight_local,uStack_468);
                    if (_buf._4_4_ != 0) {
                      return _buf._4_4_;
                    }
                  }
                  else {
                    if ((body_start_30 < 8) &&
                       ((ulong)(1L << ((byte)(body_start_30 << 3) & 0x3f)) <= uStack_468)) {
                      return 0x20c;
                    }
                    for (; body_start_30 != 0; body_start_30 = body_start_30 - 1) {
                      _is_second_flight_local->base[capacity_31 - body_start_30] =
                           (uint8_t)(uStack_468 >> (((char)body_start_30 + -1) * '\b' & 0x3fU));
                    }
                  }
                }
                if (psk_secret.base != (uint8_t *)0x0) {
                  if ((using_early_data != 0) && ((int)properties_local == 0)) {
                    capacity_32._6_2_ = 0x2a;
                    capacity_32._4_1_ = 0;
                    capacity_32._5_1_ = 0x2a;
                    _buf._4_4_ = ptls_buffer__do_pushv
                                           (_is_second_flight_local,(void *)((long)&capacity_32 + 4)
                                            ,2);
                    if (_buf._4_4_ != 0) {
                      return _buf._4_4_;
                    }
                    body_start_32 = 2;
                    _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",2);
                    if (_buf._4_4_ != 0) {
                      return _buf._4_4_;
                    }
                    body_size_32 = _is_second_flight_local->off;
                    uStack_488 = _is_second_flight_local->off - body_size_32;
                    if (body_start_32 == 0xffffffffffffffff) {
                      iVar1 = ptls_buffer__adjust_quic_blocksize(_is_second_flight_local,uStack_488)
                      ;
                      if (iVar1 != 0) {
                        return iVar1;
                      }
                    }
                    else {
                      if ((body_start_32 < 8) &&
                         ((ulong)(1L << ((byte)(body_start_32 << 3) & 0x3f)) <= uStack_488)) {
                        return 0x20c;
                      }
                      for (; body_start_32 != 0; body_start_32 = body_start_32 - 1) {
                        _is_second_flight_local->base[body_size_32 - body_start_32] =
                             (uint8_t)(uStack_488 >> (((char)body_start_32 + -1) * '\b' & 0x3fU));
                      }
                    }
                    _buf._4_4_ = 0;
                  }
                  capacity_33._6_2_ = 0x29;
                  capacity_33._4_1_ = 0;
                  capacity_33._5_1_ = 0x29;
                  _buf._4_4_ = ptls_buffer__do_pushv
                                         (_is_second_flight_local,(void *)((long)&capacity_33 + 4),2
                                         );
                  if (_buf._4_4_ != 0) {
                    return _buf._4_4_;
                  }
                  body_start_33 = 2;
                  _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",2);
                  if (_buf._4_4_ != 0) {
                    return _buf._4_4_;
                  }
                  capacity_34 = _is_second_flight_local->off;
                  body_start_34 = 2;
                  _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",2);
                  if (_buf._4_4_ != 0) {
                    return _buf._4_4_;
                  }
                  capacity_35 = _is_second_flight_local->off;
                  body_start_35 = 2;
                  _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",2);
                  if (_buf._4_4_ != 0) {
                    return _buf._4_4_;
                  }
                  body_size_35 = _is_second_flight_local->off;
                  if (properties_local._4_4_ == ENCODE_CH_MODE_OUTER) {
                    _buf._4_4_ = ptls_buffer_reserve(_is_second_flight_local,psk_identity.len);
                    if (_buf._4_4_ != 0) {
                      return _buf._4_4_;
                    }
                    (*(code *)sendbuf_local->base)
                              (_is_second_flight_local->base + _is_second_flight_local->off,
                               psk_identity.len);
                    _is_second_flight_local->off = psk_identity.len + _is_second_flight_local->off;
                  }
                  else {
                    iVar1 = ptls_buffer__do_pushv
                                      (_is_second_flight_local,psk_identity.base,psk_identity.len);
                    if (iVar1 != 0) {
                      return iVar1;
                    }
                    _buf._4_4_ = 0;
                  }
                  __v_25 = _is_second_flight_local->off - body_size_35;
                  if (body_start_35 == 0xffffffffffffffff) {
                    iVar1 = ptls_buffer__adjust_quic_blocksize(_is_second_flight_local,__v_25);
                    if (iVar1 != 0) {
                      return iVar1;
                    }
                    _buf._4_4_ = 0;
                  }
                  else {
                    if ((body_start_35 < 8) &&
                       ((ulong)(1L << ((byte)(body_start_35 << 3) & 0x3f)) <= __v_25)) {
                      return 0x20c;
                    }
                    for (; body_start_35 != 0; body_start_35 = body_start_35 - 1) {
                      _is_second_flight_local->base[body_size_35 - body_start_35] =
                           (uint8_t)(__v_25 >> (((char)body_start_35 + -1) * '\b' & 0x3fU));
                    }
                  }
                  if (properties_local._4_4_ == ENCODE_CH_MODE_OUTER) {
                    (*(code *)sendbuf_local->base)(&local_4cc,4);
                  }
                  else {
                    local_4cc = obfuscated_ticket_age;
                  }
                  local_4d0 = local_4cc;
                  body_size_34._4_1_ = (undefined1)(local_4cc >> 0x18);
                  body_size_34._5_1_ = (undefined1)(local_4cc >> 0x10);
                  body_size_34._6_1_ = (undefined1)(local_4cc >> 8);
                  body_size_34._7_1_ = (undefined1)local_4cc;
                  _buf._4_4_ = ptls_buffer__do_pushv
                                         (_is_second_flight_local,(void *)((long)&body_size_34 + 4),
                                          4);
                  if (_buf._4_4_ != 0) {
                    return _buf._4_4_;
                  }
                  uVar5 = _is_second_flight_local->off - capacity_35;
                  if (body_start_34 == 0xffffffffffffffff) {
                    iVar1 = ptls_buffer__adjust_quic_blocksize(_is_second_flight_local,uVar5);
                    if (iVar1 != 0) {
                      return iVar1;
                    }
                  }
                  else {
                    if ((body_start_34 < 8) &&
                       ((ulong)(1L << ((byte)(body_start_34 << 3) & 0x3f)) <= uVar5)) {
                      return 0x20c;
                    }
                    for (; body_start_34 != 0; body_start_34 = body_start_34 - 1) {
                      _is_second_flight_local->base[capacity_35 - body_start_34] =
                           (uint8_t)(uVar5 >> (((char)body_start_34 + -1) * '\b' & 0x3fU));
                    }
                  }
                  _buf._4_4_ = 0;
                  body_start_36 = 2;
                  _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",2);
                  if (_buf._4_4_ != 0) {
                    return _buf._4_4_;
                  }
                  sVar2 = _is_second_flight_local->off;
                  body_start_37 = 1;
                  _buf._4_4_ = ptls_buffer__do_pushv(_is_second_flight_local,"",1);
                  if (_buf._4_4_ != 0) {
                    return _buf._4_4_;
                  }
                  sVar3 = _is_second_flight_local->off;
                  _buf._4_4_ = ptls_buffer_reserve(_is_second_flight_local,psk_binder_size);
                  if (_buf._4_4_ != 0) {
                    return _buf._4_4_;
                  }
                  (*(code *)sendbuf_local->base)
                            (_is_second_flight_local->base + _is_second_flight_local->off,
                             psk_binder_size);
                  _is_second_flight_local->off = psk_binder_size + _is_second_flight_local->off;
                  uVar5 = _is_second_flight_local->off - sVar3;
                  if (0xff < uVar5) {
                    return 0x20c;
                  }
                  for (; body_start_37 != 0; body_start_37 = body_start_37 - 1) {
                    _is_second_flight_local->base[sVar3 - body_start_37] =
                         (uint8_t)(uVar5 >> (((char)body_start_37 + -1) * '\b' & 0x3fU));
                  }
                  uVar5 = _is_second_flight_local->off - sVar2;
                  if (0xffff < uVar5) {
                    return 0x20c;
                  }
                  for (; body_start_36 != 0; body_start_36 = body_start_36 - 1) {
                    _is_second_flight_local->base[sVar2 - body_start_36] =
                         (uint8_t)(uVar5 >> (((char)body_start_36 + -1) * '\b' & 0x3fU));
                  }
                  uVar5 = _is_second_flight_local->off - capacity_34;
                  if (body_start_33 == 0xffffffffffffffff) {
                    _buf._4_4_ = ptls_buffer__adjust_quic_blocksize(_is_second_flight_local,uVar5);
                    if (_buf._4_4_ != 0) {
                      return _buf._4_4_;
                    }
                  }
                  else {
                    if ((body_start_33 < 8) &&
                       ((ulong)(1L << ((byte)(body_start_33 << 3) & 0x3f)) <= uVar5)) {
                      return 0x20c;
                    }
                    for (; body_start_33 != 0; body_start_33 = body_start_33 - 1) {
                      _is_second_flight_local->base[capacity_34 - body_start_33] =
                           (uint8_t)(uVar5 >> (((char)body_start_33 + -1) * '\b' & 0x3fU));
                    }
                  }
                }
                uVar5 = _is_second_flight_local->off - sStack_e0;
                if (body_start_4 == 0xffffffffffffffff) {
                  _buf._4_4_ = ptls_buffer__adjust_quic_blocksize(_is_second_flight_local,uVar5);
                  if (_buf._4_4_ != 0) {
                    return _buf._4_4_;
                  }
                }
                else {
                  if ((body_start_4 < 8) &&
                     ((ulong)(1L << ((byte)(body_start_4 << 3) & 0x3f)) <= uVar5)) {
                    return 0x20c;
                  }
                  for (; body_start_4 != 0; body_start_4 = body_start_4 - 1) {
                    _is_second_flight_local->base[sStack_e0 - body_start_4] =
                         (uint8_t)(uVar5 >> (((char)body_start_4 + -1) * '\b' & 0x3fU));
                  }
                }
                uVar5 = *(long *)(_key_sched->secret + 0xc) - lStack_68;
                if (body_start == 0xffffffffffffffff) {
                  _buf._4_4_ = ptls_buffer__adjust_quic_blocksize((ptls_buffer_t *)_key_sched,uVar5)
                  ;
                  if (_buf._4_4_ != 0) {
                    return _buf._4_4_;
                  }
                }
                else {
                  if ((body_start < 8) && ((ulong)(1L << ((byte)(body_start << 3) & 0x3f)) <= uVar5)
                     ) {
                    return 0x20c;
                  }
                  for (; body_start != 0; body_start = body_start - 1) {
                    *(char *)(*(long *)_key_sched + (lStack_68 - body_start)) =
                         (char)(uVar5 >> (((char)body_start + -1) * '\b' & 0x3fU));
                  }
                }
                if (mess_start != 0) {
                  ptls__key_schedule_update_hash
                            ((ptls_key_schedule_t *)mess_start,
                             (uint8_t *)(*(long *)_key_sched + local_50),
                             *(long *)(_key_sched->secret + 0xc) - local_50,0);
                }
              }
            }
          }
        }
      }
    }
  }
  return _buf._4_4_;
}

Assistant:

static int encode_client_hello(ptls_context_t *ctx, ptls_buffer_t *sendbuf, enum encode_ch_mode mode, int is_second_flight,
                               ptls_handshake_properties_t *properties, const void *client_random,
                               ptls_key_exchange_context_t *key_share_ctx, const char *sni_name, ptls_iovec_t legacy_session_id,
                               struct st_ptls_ech_t *ech, size_t *ech_size_offset, ptls_iovec_t ech_replay, ptls_iovec_t psk_secret,
                               ptls_iovec_t psk_identity, uint32_t obfuscated_ticket_age, size_t psk_binder_size,
                               ptls_iovec_t *cookie, int using_early_data)
{
    int ret;

    assert(mode == ENCODE_CH_MODE_INNER || ech != NULL);

    ptls_buffer_push_message_body(sendbuf, NULL, PTLS_HANDSHAKE_TYPE_CLIENT_HELLO, {
        /* legacy_version */
        ptls_buffer_push16(sendbuf, 0x0303);
        /* random_bytes */
        ptls_buffer_pushv(sendbuf, client_random, PTLS_HELLO_RANDOM_SIZE);
        /* lecagy_session_id */
        ptls_buffer_push_block(sendbuf, 1, {
            if (mode != ENCODE_CH_MODE_ENCODED_INNER)
                ptls_buffer_pushv(sendbuf, legacy_session_id.base, legacy_session_id.len);
        });
        /* cipher_suites */
        ptls_buffer_push_block(sendbuf, 2, {
            ptls_cipher_suite_t **cs = ctx->cipher_suites;
            for (; *cs != NULL; ++cs)
                ptls_buffer_push16(sendbuf, (*cs)->id);
        });
        /* legacy_compression_methods */
        ptls_buffer_push_block(sendbuf, 1, { ptls_buffer_push(sendbuf, 0); });
        /* extensions */
        ptls_buffer_push_block(sendbuf, 2, {
            if (mode == ENCODE_CH_MODE_OUTER) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ENCRYPTED_CLIENT_HELLO, {
                    size_t ext_payload_from = sendbuf->off;
                    ptls_buffer_push(sendbuf, PTLS_ECH_CLIENT_HELLO_TYPE_OUTER);
                    ptls_buffer_push16(sendbuf, ech->cipher->id.kdf);
                    ptls_buffer_push16(sendbuf, ech->cipher->id.aead);
                    ptls_buffer_push(sendbuf, ech->config_id);
                    ptls_buffer_push_block(sendbuf, 2, {
                        if (!is_second_flight)
                            ptls_buffer_pushv(sendbuf, ech->client.enc.base, ech->client.enc.len);
                    });
                    ptls_buffer_push_block(sendbuf, 2, {
                        assert(sendbuf->off - ext_payload_from ==
                               outer_ech_header_size(is_second_flight ? 0 : ech->client.enc.len));
                        if ((ret = ptls_buffer_reserve(sendbuf, *ech_size_offset)) != 0)
                            goto Exit;
                        memset(sendbuf->base + sendbuf->off, 0, *ech_size_offset);
                        sendbuf->off += *ech_size_offset;
                        *ech_size_offset = sendbuf->off - *ech_size_offset;
                    });
                });
            } else if (ech->aead != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ENCRYPTED_CLIENT_HELLO,
                                      { ptls_buffer_push(sendbuf, PTLS_ECH_CLIENT_HELLO_TYPE_INNER); });
            } else if (ech_replay.base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ENCRYPTED_CLIENT_HELLO,
                                      { ptls_buffer_pushv(sendbuf, ech_replay.base, ech_replay.len); });
            }
            if (mode == ENCODE_CH_MODE_ENCODED_INNER) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ECH_OUTER_EXTENSIONS, {
                    ptls_buffer_push_block(sendbuf, 1, { ptls_buffer_push16(sendbuf, PTLS_EXTENSION_TYPE_KEY_SHARE); });
                });
            } else {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_KEY_SHARE, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        if (key_share_ctx != NULL &&
                            (ret = push_key_share_entry(sendbuf, key_share_ctx->algo->id, key_share_ctx->pubkey)) != 0)
                            goto Exit;
                    });
                });
            }
            if (sni_name != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SERVER_NAME, {
                    if ((ret = emit_server_name_extension(sendbuf, sni_name)) != 0)
                        goto Exit;
                });
            }
            if (properties != NULL && properties->client.negotiated_protocols.count != 0) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ALPN, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        size_t i;
                        for (i = 0; i != properties->client.negotiated_protocols.count; ++i) {
                            ptls_buffer_push_block(sendbuf, 1, {
                                ptls_iovec_t p = properties->client.negotiated_protocols.list[i];
                                ptls_buffer_pushv(sendbuf, p.base, p.len);
                            });
                        }
                    });
                });
            }
            if (ctx->decompress_certificate != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_COMPRESS_CERTIFICATE, {
                    ptls_buffer_push_block(sendbuf, 1, {
                        const uint16_t *algo = ctx->decompress_certificate->supported_algorithms;
                        assert(*algo != UINT16_MAX);
                        for (; *algo != UINT16_MAX; ++algo)
                            ptls_buffer_push16(sendbuf, *algo);
                    });
                });
            }
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS, {
                ptls_buffer_push_block(sendbuf, 1, {
                    size_t i;
                    for (i = 0; i != PTLS_ELEMENTSOF(supported_versions); ++i)
                        ptls_buffer_push16(sendbuf, supported_versions[i]);
                });
            });
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SIGNATURE_ALGORITHMS, {
                if ((ret = push_signature_algorithms(ctx->verify_certificate, sendbuf)) != 0)
                    goto Exit;
            });
            if (ctx->key_exchanges != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SUPPORTED_GROUPS, {
                    ptls_key_exchange_algorithm_t **algo = ctx->key_exchanges;
                    ptls_buffer_push_block(sendbuf, 2, {
                        for (; *algo != NULL; ++algo)
                            ptls_buffer_push16(sendbuf, (*algo)->id);
                    });
                });
            }
            if (cookie != NULL && cookie->base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_COOKIE, {
                    ptls_buffer_push_block(sendbuf, 2, { ptls_buffer_pushv(sendbuf, cookie->base, cookie->len); });
                });
            }
            if (ctx->use_raw_public_keys) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SERVER_CERTIFICATE_TYPE, {
                    ptls_buffer_push_block(sendbuf, 1, { ptls_buffer_push(sendbuf, PTLS_CERTIFICATE_TYPE_RAW_PUBLIC_KEY); });
                });
            }
            if (ctx->save_ticket != NULL &&
                (ctx->ticket_requests.client.new_session_count != 0 || ctx->ticket_requests.client.resumption_count != 0)) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_TICKET_REQUEST, {
                    ptls_buffer_push(sendbuf, ctx->ticket_requests.client.new_session_count,
                                     ctx->ticket_requests.client.resumption_count);
                });
            }
            if ((ret = push_additional_extensions(properties, sendbuf)) != 0)
                goto Exit;
            if (ctx->save_ticket != NULL || psk_secret.base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_PSK_KEY_EXCHANGE_MODES, {
                    ptls_buffer_push_block(sendbuf, 1, {
                        if (!ctx->require_dhe_on_psk)
                            ptls_buffer_push(sendbuf, PTLS_PSK_KE_MODE_PSK);
                        ptls_buffer_push(sendbuf, PTLS_PSK_KE_MODE_PSK_DHE);
                    });
                });
            }
            if (psk_secret.base != NULL) {
                if (using_early_data && !is_second_flight)
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_EARLY_DATA, {});
                /* pre-shared key "MUST be the last extension in the ClientHello" (draft-17 section 4.2.6) */
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_PRE_SHARED_KEY, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        ptls_buffer_push_block(sendbuf, 2, {
                            if (mode == ENCODE_CH_MODE_OUTER) {
                                if ((ret = ptls_buffer_reserve(sendbuf, psk_identity.len)) != 0)
                                    goto Exit;
                                ctx->random_bytes(sendbuf->base + sendbuf->off, psk_identity.len);
                                sendbuf->off += psk_identity.len;
                            } else {
                                ptls_buffer_pushv(sendbuf, psk_identity.base, psk_identity.len);
                            }
                        });
                        uint32_t age;
                        if (mode == ENCODE_CH_MODE_OUTER) {
                            ctx->random_bytes(&age, sizeof(age));
                        } else {
                            age = obfuscated_ticket_age;
                        }
                        ptls_buffer_push32(sendbuf, age);
                    });
                    /* allocate space for PSK binder. The space is filled initially filled by a random value (meeting the
                     * requirement of ClientHelloOuter), and later gets filled with the correct binder value if necessary. */
                    ptls_buffer_push_block(sendbuf, 2, {
                        ptls_buffer_push_block(sendbuf, 1, {
                            if ((ret = ptls_buffer_reserve(sendbuf, psk_binder_size)) != 0)
                                goto Exit;
                            ctx->random_bytes(sendbuf->base + sendbuf->off, psk_binder_size);
                            sendbuf->off += psk_binder_size;
                        });
                    });
                });
            }
        });
    });

Exit:
    return ret;
}